

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedData::SerializedData
          (SerializedData *this,size_t Size,IMemoryAllocator *Allocator)

{
  int iVar1;
  undefined4 extraout_var;
  void *local_48;
  IMemoryAllocator *local_30;
  IMemoryAllocator *Allocator_local;
  size_t Size_local;
  SerializedData *this_local;
  
  local_30 = Allocator;
  if (Size == 0) {
    local_30 = (IMemoryAllocator *)0x0;
  }
  this->m_pAllocator = local_30;
  if (Size == 0) {
    local_48 = (void *)0x0;
  }
  else {
    iVar1 = (**Allocator->_vptr_IMemoryAllocator)
                      (Allocator,Size,"Serialized data memory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/Serializer.cpp"
                       ,0x29);
    local_48 = (void *)CONCAT44(extraout_var,iVar1);
  }
  this->m_Ptr = local_48;
  this->m_Size = Size;
  std::atomic<unsigned_long>::atomic(&this->m_Hash,0);
  memset(this->m_Ptr,0,this->m_Size);
  return;
}

Assistant:

SerializedData::SerializedData(size_t Size, IMemoryAllocator& Allocator) noexcept :
    m_pAllocator{Size > 0 ? &Allocator : nullptr},
    m_Ptr{Size > 0 ? Allocator.Allocate(Size, "Serialized data memory", __FILE__, __LINE__) : nullptr},
    m_Size{Size}
{
    // We need to zero out memory as due to element alignment, there may be gaps
    // in the data that will be filled with garbage, which will result in
    // operator==() and GetHash() returning invalid values.
    std::memset(m_Ptr, 0, m_Size);
}